

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

void __thiscall EncodingTable::~EncodingTable(EncodingTable *this)

{
  std::_Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::
  ~_Vector_base(&(this->entries).
                 super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
               );
  std::__cxx11::wstring::~wstring((wstring *)&this->valueData);
  ByteArray::~ByteArray(&this->hexData);
  return;
}

Assistant:

EncodingTable::~EncodingTable()
{

}